

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsException.c
# Opt level: O1

void JsBuildDefender(void *jmp_buf_p)

{
  undefined8 *value;
  JsList pvVar1;
  
  JsAssert((uint)(jmp_buf_p != (void *)0x0));
  value = (undefined8 *)JsGetTlsValue(eKey);
  if (value == (undefined8 *)0x0) {
    value = (undefined8 *)JsMalloc(0x18);
    pvVar1 = JsCreateList();
    *value = pvVar1;
    pvVar1 = JsCreateList();
    value[1] = pvVar1;
    value[2] = 0;
    JsSetTlsValue(eKey,value);
  }
  JsListPush((void *)*value,jmp_buf_p);
  return;
}

Assistant:

void JsBuildDefender(void* jmp_buf_p){
	JsAssert(jmp_buf_p != NULL);
	struct JsException* p  = (struct JsException*)JsGetTlsValue(eKey);
	if( p == NULL){
		//TLS中没有对应的Exception对象
		p = (struct JsException* )JsMalloc(sizeof(struct JsException));
		p->defenders = JsCreateList();
		p->stack = JsCreateList();
		p->err = NULL;
		JsSetTlsValue(eKey,p);
	}
	//压入该还原点
	JsListPush(p->defenders,jmp_buf_p);
}